

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

void readfiles(char *path,char *s,uchar (*pic) [512] [512],float sigma,int pic_t,int *pic_x,
              int *pic_y,int start,int end,uchar *header)

{
  bool bVar1;
  FILE *__stream;
  size_t sVar2;
  size_t sVar3;
  uchar (*__ptr) [512];
  long lVar4;
  int ints [8];
  char fname [200];
  
  puts("Reading Files...");
  if (end < start) {
    puts("\nSpecified time for writing file incorrect");
  }
  else {
    bVar1 = true;
    while( true ) {
      if (end < start) {
        return;
      }
      sprintf(fname,"%s/%s%d",path,s,(ulong)(uint)start);
      __stream = fopen(fname,"rb");
      if (__stream == (FILE *)0x0) break;
      sVar2 = 0;
      if (BINARY == 0) {
        if (bVar1) {
          sVar2 = fread(ints,4,8,__stream);
          sVar2 = (size_t)(uint)((int)sVar2 << 2);
          *pic_y = ints[1];
          *pic_x = ints[2];
        }
        else {
          sVar2 = fread(header,1,0x20,__stream);
        }
        bVar1 = false;
      }
      lVar4 = 0;
      __ptr = *pic;
      for (; lVar4 < *pic_x; lVar4 = lVar4 + 1) {
        sVar3 = fread(__ptr,1,(long)*pic_y,__stream);
        sVar2 = (size_t)(uint)((int)sVar2 + (int)sVar3);
        __ptr = __ptr + 1;
      }
      printf("File %s read (%d bytes)\n",fname,sVar2 & 0xffffffff);
      fclose(__stream);
      fflush(_stdout);
      start = start + 1;
      pic = (uchar (*) [512] [512])((long)pic + 0x40000);
    }
    printf("File %s does not exist in readfiles.\n",fname);
  }
  exit(1);
}

Assistant:

void readfiles(char path[], char s[],
unsigned char pic[][PIC_X][PIC_Y],
float sigma, int pic_t, int *pic_x, int *pic_y, int start, int end,
unsigned char header[HEAD])

{
char fname[200];
int i,j,time,no_bytes;
int ONCE;
int ints[8];
FILE *fp;


printf("Reading Files...\n");
time = -1;
if((end-start) < 0)
	{
	printf("\nSpecified time for writing file incorrect\n");
	exit(1);
	}
ONCE = TRUE;
for(i=start;i<=end;i++)
	{
	time++;
	no_bytes = 0;
	sprintf(fname,"%s/%s%d",path,s,i);  //.ras
 	if((fp=fopen(fname,"rb")) != NULL)
		{
		if(!BINARY)
		{
		if(ONCE)
		{
		no_bytes += (4*fread(ints, sizeof(int), 8, fp));
		(*pic_y) = ints[1];
		(*pic_x) = ints[2];
		ONCE = FALSE;
		}
		else no_bytes += fread(header, sizeof(unsigned char), HEAD, fp);
		}

		for(j=0;j<(*pic_x);j++)
			no_bytes += fread(&pic[time][j][0],sizeof(unsigned char), (*pic_y), fp);
		printf("File %s read (%d bytes)\n",fname,no_bytes);
		no_bytes = 0;
		fclose(fp);
		}
	else
		{
		printf("File %s does not exist in readfiles.\n",fname);
		exit(1);
		}
	fflush(stdout);
	}
}